

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

pointer __thiscall
google::protobuf::RepeatedField<float>::AddNAlreadyReserved(RepeatedField<float> *this,int n)

{
  ulong uVar1;
  int iVar2;
  Nullable<const_char_*> failure_msg;
  char *pcVar3;
  LogMessage *pLVar4;
  int v;
  LogMessage LStack_38;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  iVar2 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  if ((uVar1 & 4) == 0) {
    v = 2;
  }
  else {
    v = (this->soo_rep_).field_0.long_rep.capacity;
  }
  failure_msg = absl::lts_20250127::log_internal::Check_GEImpl
                          (v - iVar2,n,"capacity - old_size >= n");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    if ((uVar1 & 4) == 0) {
      pcVar3 = (char *)((long)&(this->soo_rep_).field_0 + 8);
    }
    else {
      pcVar3 = internal::LongSooRep::elements((LongSooRep *)this);
    }
    iVar2 = ExchangeCurrentSize(this,(uVar1 & 4) == 0,iVar2 + n);
    return (pointer)(pcVar3 + (long)iVar2 * 4);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
             ,0x307,failure_msg);
  pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_38,v);
  pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,(char (*) [3])0x1026887);
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,iVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_38)
  ;
}

Assistant:

inline Element* RepeatedField<Element>::AddNAlreadyReserved(int n)
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  [[maybe_unused]] const int capacity = Capacity(is_soo);
  ABSL_DCHECK_GE(capacity - old_size, n) << capacity << ", " << old_size;
  Element* p =
      unsafe_elements(is_soo) + ExchangeCurrentSize(is_soo, old_size + n);
  for (Element *begin = p, *end = p + n; begin != end; ++begin) {
    new (static_cast<void*>(begin)) Element;
  }
  return p;
}